

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::NetState::InternalSerializeWithCachedSizesToArray
          (NetState *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  Phase value;
  int32 value_00;
  int iVar2;
  int size;
  char *data;
  string *value_01;
  UnknownFieldSet *unknown_fields;
  int local_48;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  NetState *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 2) != 0) {
    value = phase(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,value,target);
  }
  if ((uVar1 & 1) != 0) {
    value_00 = level(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,value_00,_i);
  }
  local_48 = 0;
  iVar2 = stage_size(this);
  for (; local_48 < iVar2; local_48 = local_48 + 1) {
    stage_abi_cxx11_(this,local_48);
    data = (char *)std::__cxx11::string::data();
    stage_abi_cxx11_(this,local_48);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"caffe.NetState.stage");
    value_01 = stage_abi_cxx11_(this,local_48);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,value_01,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetState::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* NetState::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1 [default = TEST];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 level = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->level(), target);
  }

  // repeated string stage = 3;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetState.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetState)
  return target;
}